

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o2.cc
# Opt level: O0

void __thiscall
lf::geometry::SegmentO2::SegmentO2(SegmentO2 *this,Matrix<double,__1,_3,_0,__1,_3> *coords)

{
  RealScalar RVar1;
  ReturnType RVar2;
  ColXpr local_700;
  ColXpr local_6c8;
  ColXpr local_690;
  double local_658;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_650;
  ColXpr local_5f0;
  double local_5b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_5b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
  local_550;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_480;
  ColXpr local_368;
  double local_330;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_328;
  ColXpr local_2c8;
  ColXpr local_290;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_258;
  double local_1e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
  local_1d8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
  local_138;
  Matrix<double,__1,_3,_0,__1,_3> *local_18;
  Matrix<double,__1,_3,_0,__1,_3> *coords_local;
  SegmentO2 *this_local;
  
  local_18 = coords;
  coords_local = (Matrix<double,__1,_3,_0,__1,_3> *)this;
  Geometry::Geometry(&this->super_Geometry);
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_00df7578;
  Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::Matrix(&this->coords_,coords);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->alpha_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->beta_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->gamma_);
  this->alpha_squared_ = 0.0;
  this->alpha_beta_ = 0.0;
  this->beta_squared_ = 0.0;
  local_1e0 = 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_290,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_2c8,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>>::operator+
            (&local_258,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>> *)&local_290,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_> *)
             &local_2c8);
  Eigen::operator*(&local_1d8,&local_1e0,(StorageBaseType *)&local_258);
  local_330 = 4.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_368,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,2);
  Eigen::operator*(&local_328,&local_330,(StorageBaseType *)&local_368);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>const>const>>
  ::operator-(&local_138,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>const>>
               *)&local_1d8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
               *)&local_328);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->alpha_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>_>
              *)&local_138);
  local_5b8 = 4.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_5f0,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,2);
  Eigen::operator*(&local_5b0,&local_5b8,(StorageBaseType *)&local_5f0);
  local_658 = 3.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_690,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,0);
  Eigen::operator*(&local_650,&local_658,(StorageBaseType *)&local_690);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>const>>
  ::operator-(&local_550,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>>
               *)&local_5b0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
               *)&local_650);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_6c8,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,1);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>const>const>>
  ::operator-(&local_480,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>const>>
               *)&local_550,
              (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_> *)
              &local_6c8);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->beta_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
              *)&local_480);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_700,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->gamma_,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_> *)
             &local_700);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::squaredNorm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->alpha_);
  this->alpha_squared_ = RVar1;
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->alpha_,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->beta_);
  this->alpha_beta_ = RVar2;
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::squaredNorm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->beta_);
  this->beta_squared_ = RVar1;
  return;
}

Assistant:

SegmentO2::SegmentO2(Eigen::Matrix<double, Eigen::Dynamic, 3> coords)
    : coords_(std::move(coords)) {
  // polynomial of degree 2: alpha * x^2 + beta * x + gamma
  alpha_ = 2. * (coords_.col(1) + coords_.col(0)) - 4. * coords_.col(2);
  beta_ = 4. * coords_.col(2) - 3. * coords_.col(0) - coords_.col(1);
  gamma_ = coords_.col(0);

  // coefficients for JacobianInverseGramian and IntegrationElement
  alpha_squared_ = alpha_.squaredNorm();
  alpha_beta_ = alpha_.dot(beta_);
  beta_squared_ = beta_.squaredNorm();
}